

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O3

void InvalidateBlock(ChainstateManager *chainman,uint256 block_hash)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  CBlockIndex *pindex;
  Chainstate *pCVar3;
  UniValue *pUVar4;
  RecursiveMutex *pRVar5;
  long in_FS_OFFSET;
  shared_ptr<const_CBlock> pblock;
  BlockValidationState state;
  undefined1 local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  unique_lock<std::recursive_mutex> local_a8;
  string local_98;
  ValidationState<BlockValidationResult> local_78;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_78.m_reject_reason.field_2;
  local_78.m_mode = M_VALID;
  local_78.m_result = BLOCK_RESULT_UNSET;
  local_78.m_reject_reason._M_string_length = 0;
  local_78.m_reject_reason.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_78.m_debug_message.field_2;
  local_78.m_debug_message._M_string_length = 0;
  local_78.m_debug_message.field_2._M_local_buf[0] = '\0';
  pRVar5 = &cs_main;
  local_a8._M_device = &cs_main.super_recursive_mutex;
  local_a8._M_owns = false;
  local_78.m_reject_reason._M_dataplus._M_p = (pointer)paVar1;
  local_78.m_debug_message._M_dataplus._M_p = (pointer)paVar2;
  std::unique_lock<std::recursive_mutex>::lock(&local_a8);
  pindex = node::BlockManager::LookupBlockIndex(&chainman->m_blockman,&block_hash);
  if (pindex == (CBlockIndex *)0x0) {
    pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Block not found","");
    JSONRPCError(pUVar4,-5,&local_98);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_a8);
    pCVar3 = ChainstateManager::ActiveChainstate(chainman);
    Chainstate::InvalidateBlock(pCVar3,(BlockValidationState *)&local_78,pindex);
    if (local_78.m_mode == M_VALID) {
      pCVar3 = ChainstateManager::ActiveChainstate(chainman);
      local_b8._0_4_ = 0;
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pRVar5;
      pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_b8;
      Chainstate::ActivateBestChain(pCVar3,(BlockValidationState *)&local_78,pblock);
      if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
      }
      if (local_78.m_mode == M_VALID) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.m_debug_message._M_dataplus._M_p != paVar2) {
          operator_delete(local_78.m_debug_message._M_dataplus._M_p,
                          CONCAT71(local_78.m_debug_message.field_2._M_allocated_capacity._1_7_,
                                   local_78.m_debug_message.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.m_reject_reason._M_dataplus._M_p != paVar1) {
          operator_delete(local_78.m_reject_reason._M_dataplus._M_p,
                          CONCAT71(local_78.m_reject_reason.field_2._M_allocated_capacity._1_7_,
                                   local_78.m_reject_reason.field_2._M_local_buf[0]) + 1);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          return;
        }
        goto LAB_002987fb;
      }
    }
    pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_(&local_98,&local_78);
    JSONRPCError(pUVar4,-0x14,&local_98);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
LAB_002987fb:
  __stack_chk_fail();
}

Assistant:

void InvalidateBlock(ChainstateManager& chainman, const uint256 block_hash) {
    BlockValidationState state;
    CBlockIndex* pblockindex;
    {
        LOCK(chainman.GetMutex());
        pblockindex = chainman.m_blockman.LookupBlockIndex(block_hash);
        if (!pblockindex) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
        }
    }
    chainman.ActiveChainstate().InvalidateBlock(state, pblockindex);

    if (state.IsValid()) {
        chainman.ActiveChainstate().ActivateBestChain(state);
    }

    if (!state.IsValid()) {
        throw JSONRPCError(RPC_DATABASE_ERROR, state.ToString());
    }
}